

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
backward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,tensor *gradient_input,
          subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
          *sub,tensor *params_grad)

{
  tensor *gamma_grad;
  tensor *gradient_input_00;
  tensor *eps;
  tensor *in_RCX;
  tensor *means;
  tensor *in_RSI;
  long in_RDI;
  alias_tensor_instance b_grad;
  alias_tensor_instance g_grad;
  alias_tensor_instance g;
  tensor *in_stack_fffffffffffffe98;
  tensor *src;
  tensor local_108 [4];
  tensor *local_20;
  tensor *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  gamma_grad = (tensor *)(in_RDI + 0xe0);
  alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  src = *(tensor **)(in_RDI + 0x3b8);
  means = (tensor *)(in_RDI + 0x128);
  gradient_input_00 = (tensor *)(in_RDI + 600);
  eps = dimpl::
        subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
        ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
                      *)0x20ce26);
  dimpl::
  subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
  ::get_gradient_input
            ((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
              *)0x20ce38);
  tt::batch_normalize_conv_gradient
            ((double)eps,gradient_input_00,means,local_10,src,in_stack_fffffffffffffe98,local_108,
             gamma_grad,local_20);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20ce8e);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20ce9b);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20cea8);
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            auto g = gamma(params,0);
            auto g_grad = gamma(params_grad, 0);
            auto b_grad = beta(params_grad, gamma.size());
            if (mode == FC_MODE)
                tt::batch_normalize_gradient(eps, gradient_input, means, invstds, sub.get_output(), g, sub.get_gradient_input(), g_grad, b_grad );
            else
                tt::batch_normalize_conv_gradient(eps, gradient_input, means, invstds, sub.get_output(), g, sub.get_gradient_input(), g_grad, b_grad );
        }